

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPoint>::X
          (TPZGeoElRefLess<pzgeom::TPZGeoPoint> *this,TPZVec<double> *coordinate,
          TPZVec<double> *result)

{
  TPZFNMatrix<54,_double> cornerco;
  TPZVec<double> *in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZFNMatrix<54,_double> *in_stack_fffffffffffffda0;
  
  TPZFNMatrix<54,_double>::TPZFNMatrix
            (in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98,
             (int64_t)in_stack_fffffffffffffd90);
  CornerCoordinates((TPZGeoElRefLess<pzgeom::TPZGeoPoint> *)in_stack_fffffffffffffda0,
                    in_stack_fffffffffffffd98);
  pzgeom::TPZGeoPoint::X<double>
            (&in_stack_fffffffffffffda0->super_TPZFMatrix<double>,
             (TPZVec<double> *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  TPZFNMatrix<54,_double>::~TPZFNMatrix((TPZFNMatrix<54,_double> *)0x15fb5cc);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::X(TPZVec<REAL> &coordinate,TPZVec<REAL> &result) const {
#ifdef PZDEBUG
    if(result.size() != 3) DebugStop();
#endif
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
	fGeo.X(cornerco,coordinate,result);
}